

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::addChildLimited<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          vector<int,_std::allocator<int>_> *level_limits,Data2D<int> *destination)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  const_reference pvVar5;
  int local_6c;
  int i;
  int max_1d_kids;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> kid;
  Data2D<int> *destination_local;
  vector<int,_std::allocator<int>_> *level_limits_local;
  MultiIndexSet *exclude_local;
  int direction_local;
  int *point_local;
  GridLocalPolynomial *this_local;
  
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)destination;
  ::std::allocator<int>::allocator(&local_51);
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_50,point,point + iVar2,&local_51);
  ::std::allocator<int>::~allocator(&local_51);
  iVar2 = RuleLocal::getMaxNumKids<(TasGrid::RuleLocal::erule)3>();
  local_6c = 0;
  do {
    if (iVar2 <= local_6c) {
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_50);
      return;
    }
    iVar3 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)3>(point[direction],local_6c);
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)direction);
    *pvVar4 = iVar3;
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)direction);
    if (*pvVar4 != -1) {
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)level_limits,(long)direction);
      if (*pvVar5 != -1) {
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,(long)direction);
        iVar3 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)3>(*pvVar4);
        pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)level_limits,(long)direction);
        if (*pvVar5 < iVar3) goto LAB_002a98dc;
      }
      bVar1 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)local_50);
      if (bVar1) {
        Data2D<int>::appendStrip
                  ((Data2D<int> *)
                   kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_50);
      }
    }
LAB_002a98dc:
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

void GridLocalPolynomial::addChildLimited(const int point[], int direction, const MultiIndexSet &exclude, const std::vector<int> &level_limits, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    for(int i=0; i<max_1d_kids; i++){
        kid[direction] = RuleLocal::getKid<effrule>(point[direction], i);
        if ((kid[direction] != -1)
            && ((level_limits[direction] == -1) || (RuleLocal::getLevel<effrule>(kid[direction]) <= level_limits[direction]))
            && exclude.missing(kid)){
            destination.appendStrip(kid);
        }
    }
}